

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O0

void mp3d_synth(float *xl,mp3d_sample_t *dstl,int nch,float *lins)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  undefined4 *puVar30;
  long lVar31;
  long lVar32;
  long in_RCX;
  float *pfVar33;
  int in_EDX;
  long in_RSI;
  undefined4 *in_RDI;
  undefined1 auVar34 [16];
  __m128i pcm8;
  f4 vy_7;
  f4 vz_7;
  f4 w1_7;
  f4 w0_7;
  f4 vy_6;
  f4 vz_6;
  f4 w1_6;
  f4 w0_6;
  f4 vy_5;
  f4 vz_5;
  f4 w1_5;
  f4 w0_5;
  f4 vy_4;
  f4 vz_4;
  f4 w1_4;
  f4 w0_4;
  f4 vy_3;
  f4 vz_3;
  f4 w1_3;
  f4 w0_3;
  f4 vy_2;
  f4 vz_2;
  f4 w1_2;
  f4 w0_2;
  f4 vy_1;
  f4 vz_1;
  f4 w1_1;
  f4 w0_1;
  f4 vy;
  f4 vz;
  f4 w1;
  f4 w0;
  f4 b;
  f4 a;
  float *w;
  float *zlin;
  mp3d_sample_t *dstr;
  float *xr;
  int i;
  undefined8 local_d88;
  undefined8 in_stack_fffffffffffff288;
  mp3d_sample_t *in_stack_fffffffffffff290;
  float *local_b50;
  int local_b2c;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  
  iVar29 = (int)((ulong)in_stack_fffffffffffff288 >> 0x20);
  puVar30 = in_RDI + (in_EDX + -1) * 0x240;
  lVar31 = in_RSI + (long)(in_EDX + -1) * 2;
  lVar32 = in_RCX + 0xf00;
  local_b50 = mp3d_synth::g_win;
  *(undefined4 *)(in_RCX + 0xff0) = in_RDI[0x120];
  *(undefined4 *)(in_RCX + 0xff4) = puVar30[0x120];
  *(undefined4 *)(in_RCX + 0xff8) = *in_RDI;
  *(undefined4 *)(in_RCX + 0xffc) = *puVar30;
  *(undefined4 *)(in_RCX + 0x10f0) = in_RDI[0x121];
  *(undefined4 *)(in_RCX + 0x10f4) = puVar30[0x121];
  *(undefined4 *)(in_RCX + 0x10f8) = in_RDI[1];
  *(undefined4 *)(in_RCX + 0x10fc) = puVar30[1];
  mp3d_synth_pair(in_stack_fffffffffffff290,iVar29,local_d88);
  mp3d_synth_pair(in_stack_fffffffffffff290,iVar29,local_d88);
  mp3d_synth_pair(in_stack_fffffffffffff290,iVar29,local_d88);
  mp3d_synth_pair(in_stack_fffffffffffff290,iVar29,local_d88);
  iVar29 = have_simd();
  if (iVar29 != 0) {
    for (local_b2c = 0xe; -1 < local_b2c; local_b2c = local_b2c + -1) {
      *(undefined4 *)(lVar32 + (long)(local_b2c << 2) * 4) = in_RDI[(0x1f - local_b2c) * 0x12];
      *(undefined4 *)(in_RCX + 0xf04 + (long)(local_b2c << 2) * 4) =
           puVar30[(0x1f - local_b2c) * 0x12];
      *(undefined4 *)(in_RCX + 0xf08 + (long)(local_b2c << 2) * 4) =
           in_RDI[(long)((0x1f - local_b2c) * 0x12) + 1];
      *(undefined4 *)(in_RCX + 0xf0c + (long)(local_b2c << 2) * 4) =
           puVar30[(long)((0x1f - local_b2c) * 0x12) + 1];
      *(undefined4 *)(in_RCX + 0x1000 + (long)(local_b2c << 2) * 4) =
           in_RDI[(long)(local_b2c * 0x12 + 0x12) + 1];
      *(undefined4 *)(in_RCX + 0x1004 + (long)(local_b2c << 2) * 4) =
           puVar30[(long)(local_b2c * 0x12 + 0x12) + 1];
      *(undefined4 *)(in_RCX + 0xf08 + (long)(local_b2c * 4 + -0x40) * 4) =
           in_RDI[local_b2c * 0x12 + 0x12];
      *(undefined4 *)(in_RCX + 0xf0c + (long)(local_b2c * 4 + -0x40) * 4) =
           puVar30[local_b2c * 0x12 + 0x12];
      fVar2 = *local_b50;
      fVar3 = local_b50[1];
      puVar1 = (undefined8 *)(lVar32 + (long)(local_b2c << 2) * 4);
      uVar18 = *puVar1;
      uVar19 = puVar1[1];
      puVar1 = (undefined8 *)(lVar32 + (long)(local_b2c * 4 + -0x3c0) * 4);
      uVar20 = *puVar1;
      uVar21 = puVar1[1];
      local_2d8 = (float)uVar18;
      fStack_2d4 = (float)((ulong)uVar18 >> 0x20);
      fStack_2d0 = (float)uVar19;
      fStack_2cc = (float)((ulong)uVar19 >> 0x20);
      local_2f8 = (float)uVar20;
      fStack_2f4 = (float)((ulong)uVar20 >> 0x20);
      fStack_2f0 = (float)uVar21;
      fStack_2ec = (float)((ulong)uVar21 >> 0x20);
      fVar4 = local_b50[2];
      fVar5 = local_b50[3];
      puVar1 = (undefined8 *)(lVar32 + (long)(local_b2c * 4 + -0x40) * 4);
      uVar18 = *puVar1;
      uVar19 = puVar1[1];
      puVar1 = (undefined8 *)(lVar32 + (long)(local_b2c * 4 + -0x380) * 4);
      uVar20 = *puVar1;
      uVar21 = puVar1[1];
      local_358 = (float)uVar18;
      fStack_354 = (float)((ulong)uVar18 >> 0x20);
      fStack_350 = (float)uVar19;
      fStack_34c = (float)((ulong)uVar19 >> 0x20);
      local_378 = (float)uVar20;
      fStack_374 = (float)((ulong)uVar20 >> 0x20);
      fStack_370 = (float)uVar21;
      fStack_36c = (float)((ulong)uVar21 >> 0x20);
      fVar6 = local_b50[4];
      fVar7 = local_b50[5];
      puVar1 = (undefined8 *)(lVar32 + (long)(local_b2c * 4 + -0x80) * 4);
      uVar18 = *puVar1;
      uVar19 = puVar1[1];
      puVar1 = (undefined8 *)(lVar32 + (long)(local_b2c * 4 + -0x340) * 4);
      uVar20 = *puVar1;
      uVar21 = puVar1[1];
      local_3d8 = (float)uVar18;
      fStack_3d4 = (float)((ulong)uVar18 >> 0x20);
      fStack_3d0 = (float)uVar19;
      fStack_3cc = (float)((ulong)uVar19 >> 0x20);
      local_3f8 = (float)uVar20;
      fStack_3f4 = (float)((ulong)uVar20 >> 0x20);
      fStack_3f0 = (float)uVar21;
      fStack_3ec = (float)((ulong)uVar21 >> 0x20);
      fVar8 = local_b50[6];
      fVar9 = local_b50[7];
      puVar1 = (undefined8 *)(lVar32 + (long)(local_b2c * 4 + -0xc0) * 4);
      uVar18 = *puVar1;
      uVar19 = puVar1[1];
      puVar1 = (undefined8 *)(lVar32 + (long)(local_b2c * 4 + -0x300) * 4);
      uVar20 = *puVar1;
      uVar21 = puVar1[1];
      local_458 = (float)uVar18;
      fStack_454 = (float)((ulong)uVar18 >> 0x20);
      fStack_450 = (float)uVar19;
      fStack_44c = (float)((ulong)uVar19 >> 0x20);
      local_478 = (float)uVar20;
      fStack_474 = (float)((ulong)uVar20 >> 0x20);
      fStack_470 = (float)uVar21;
      fStack_46c = (float)((ulong)uVar21 >> 0x20);
      fVar10 = local_b50[8];
      fVar11 = local_b50[9];
      puVar1 = (undefined8 *)(lVar32 + (long)(local_b2c * 4 + -0x100) * 4);
      uVar18 = *puVar1;
      uVar19 = puVar1[1];
      puVar1 = (undefined8 *)(lVar32 + (long)(local_b2c * 4 + -0x2c0) * 4);
      uVar20 = *puVar1;
      uVar21 = puVar1[1];
      local_4d8 = (float)uVar18;
      fStack_4d4 = (float)((ulong)uVar18 >> 0x20);
      fStack_4d0 = (float)uVar19;
      fStack_4cc = (float)((ulong)uVar19 >> 0x20);
      local_4f8 = (float)uVar20;
      fStack_4f4 = (float)((ulong)uVar20 >> 0x20);
      fStack_4f0 = (float)uVar21;
      fStack_4ec = (float)((ulong)uVar21 >> 0x20);
      fVar12 = local_b50[10];
      fVar13 = local_b50[0xb];
      puVar1 = (undefined8 *)(lVar32 + (long)(local_b2c * 4 + -0x140) * 4);
      uVar18 = *puVar1;
      uVar19 = puVar1[1];
      puVar1 = (undefined8 *)(lVar32 + (long)(local_b2c * 4 + -0x280) * 4);
      uVar20 = *puVar1;
      uVar21 = puVar1[1];
      local_558 = (float)uVar18;
      fStack_554 = (float)((ulong)uVar18 >> 0x20);
      fStack_550 = (float)uVar19;
      fStack_54c = (float)((ulong)uVar19 >> 0x20);
      local_578 = (float)uVar20;
      fStack_574 = (float)((ulong)uVar20 >> 0x20);
      fStack_570 = (float)uVar21;
      fStack_56c = (float)((ulong)uVar21 >> 0x20);
      fVar14 = local_b50[0xc];
      fVar15 = local_b50[0xd];
      puVar1 = (undefined8 *)(lVar32 + (long)(local_b2c * 4 + -0x180) * 4);
      uVar18 = *puVar1;
      uVar19 = puVar1[1];
      puVar1 = (undefined8 *)(lVar32 + (long)(local_b2c * 4 + -0x240) * 4);
      uVar20 = *puVar1;
      uVar21 = puVar1[1];
      local_5d8 = (float)uVar18;
      fStack_5d4 = (float)((ulong)uVar18 >> 0x20);
      fStack_5d0 = (float)uVar19;
      fStack_5cc = (float)((ulong)uVar19 >> 0x20);
      local_5f8 = (float)uVar20;
      fStack_5f4 = (float)((ulong)uVar20 >> 0x20);
      fStack_5f0 = (float)uVar21;
      fStack_5ec = (float)((ulong)uVar21 >> 0x20);
      pfVar33 = local_b50 + 0xf;
      fVar16 = local_b50[0xe];
      local_b50 = local_b50 + 0x10;
      fVar17 = *pfVar33;
      puVar1 = (undefined8 *)(lVar32 + (long)(local_b2c * 4 + -0x1c0) * 4);
      uVar18 = *puVar1;
      uVar19 = puVar1[1];
      puVar1 = (undefined8 *)(lVar32 + (long)(local_b2c * 4 + -0x200) * 4);
      uVar20 = *puVar1;
      uVar21 = puVar1[1];
      local_658 = (float)uVar18;
      fStack_654 = (float)((ulong)uVar18 >> 0x20);
      fStack_650 = (float)uVar19;
      fStack_64c = (float)((ulong)uVar19 >> 0x20);
      local_678 = (float)uVar20;
      fStack_674 = (float)((ulong)uVar20 >> 0x20);
      fStack_670 = (float)uVar21;
      fStack_66c = (float)((ulong)uVar21 >> 0x20);
      auVar28._4_4_ =
           (fStack_2d4 * fVar2 - fStack_2f4 * fVar3) + (fStack_374 * fVar5 - fStack_354 * fVar4) +
           (fStack_3d4 * fVar6 - fStack_3f4 * fVar7) + (fStack_474 * fVar9 - fStack_454 * fVar8) +
           (fStack_4d4 * fVar10 - fStack_4f4 * fVar11) + (fStack_574 * fVar13 - fStack_554 * fVar12)
           + (fStack_5d4 * fVar14 - fStack_5f4 * fVar15) +
           (fStack_674 * fVar17 - fStack_654 * fVar16);
      auVar28._0_4_ =
           (local_2d8 * fVar2 - local_2f8 * fVar3) + (local_378 * fVar5 - local_358 * fVar4) +
           (local_3d8 * fVar6 - local_3f8 * fVar7) + (local_478 * fVar9 - local_458 * fVar8) +
           (local_4d8 * fVar10 - local_4f8 * fVar11) + (local_578 * fVar13 - local_558 * fVar12) +
           (local_5d8 * fVar14 - local_5f8 * fVar15) + (local_678 * fVar17 - local_658 * fVar16);
      auVar28._12_4_ =
           (fStack_2cc * fVar2 - fStack_2ec * fVar3) + (fStack_36c * fVar5 - fStack_34c * fVar4) +
           (fStack_3cc * fVar6 - fStack_3ec * fVar7) + (fStack_46c * fVar9 - fStack_44c * fVar8) +
           (fStack_4cc * fVar10 - fStack_4ec * fVar11) + (fStack_56c * fVar13 - fStack_54c * fVar12)
           + (fStack_5cc * fVar14 - fStack_5ec * fVar15) +
           (fStack_66c * fVar17 - fStack_64c * fVar16);
      auVar28._8_4_ =
           (fStack_2d0 * fVar2 - fStack_2f0 * fVar3) + (fStack_370 * fVar5 - fStack_350 * fVar4) +
           (fStack_3d0 * fVar6 - fStack_3f0 * fVar7) + (fStack_470 * fVar9 - fStack_450 * fVar8) +
           (fStack_4d0 * fVar10 - fStack_4f0 * fVar11) + (fStack_570 * fVar13 - fStack_550 * fVar12)
           + (fStack_5d0 * fVar14 - fStack_5f0 * fVar15) +
           (fStack_670 * fVar17 - fStack_650 * fVar16);
      auVar27._8_8_ = 0x46fffe0046fffe00;
      auVar27._0_8_ = 0x46fffe0046fffe00;
      auVar34 = minps(auVar28,auVar27);
      auVar24._8_8_ = 0xc7000000c7000000;
      auVar24._0_8_ = 0xc7000000c7000000;
      auVar34 = maxps(auVar34,auVar24);
      local_98 = auVar34._0_4_;
      fStack_94 = auVar34._4_4_;
      fStack_90 = auVar34._8_4_;
      fStack_8c = auVar34._12_4_;
      auVar26._4_4_ =
           fStack_2d4 * fVar3 + fStack_2f4 * fVar2 + fStack_354 * fVar5 + fStack_374 * fVar4 +
           fStack_3d4 * fVar7 + fStack_3f4 * fVar6 + fStack_454 * fVar9 + fStack_474 * fVar8 +
           fStack_4d4 * fVar11 + fStack_4f4 * fVar10 + fStack_554 * fVar13 + fStack_574 * fVar12 +
           fStack_5d4 * fVar15 + fStack_5f4 * fVar14 + fStack_654 * fVar17 + fStack_674 * fVar16;
      auVar26._0_4_ =
           local_2d8 * fVar3 + local_2f8 * fVar2 + local_358 * fVar5 + local_378 * fVar4 +
           local_3d8 * fVar7 + local_3f8 * fVar6 + local_458 * fVar9 + local_478 * fVar8 +
           local_4d8 * fVar11 + local_4f8 * fVar10 + local_558 * fVar13 + local_578 * fVar12 +
           local_5d8 * fVar15 + local_5f8 * fVar14 + local_658 * fVar17 + local_678 * fVar16;
      auVar26._12_4_ =
           fStack_2cc * fVar3 + fStack_2ec * fVar2 + fStack_34c * fVar5 + fStack_36c * fVar4 +
           fStack_3cc * fVar7 + fStack_3ec * fVar6 + fStack_44c * fVar9 + fStack_46c * fVar8 +
           fStack_4cc * fVar11 + fStack_4ec * fVar10 + fStack_54c * fVar13 + fStack_56c * fVar12 +
           fStack_5cc * fVar15 + fStack_5ec * fVar14 + fStack_64c * fVar17 + fStack_66c * fVar16;
      auVar26._8_4_ =
           fStack_2d0 * fVar3 + fStack_2f0 * fVar2 + fStack_350 * fVar5 + fStack_370 * fVar4 +
           fStack_3d0 * fVar7 + fStack_3f0 * fVar6 + fStack_450 * fVar9 + fStack_470 * fVar8 +
           fStack_4d0 * fVar11 + fStack_4f0 * fVar10 + fStack_550 * fVar13 + fStack_570 * fVar12 +
           fStack_5d0 * fVar15 + fStack_5f0 * fVar14 + fStack_650 * fVar17 + fStack_670 * fVar16;
      auVar25._8_8_ = 0x46fffe0046fffe00;
      auVar25._0_8_ = 0x46fffe0046fffe00;
      auVar34 = minps(auVar26,auVar25);
      auVar23._8_8_ = 0xc7000000c7000000;
      auVar23._0_8_ = 0xc7000000c7000000;
      auVar34 = maxps(auVar34,auVar23);
      local_a8 = auVar34._0_4_;
      fStack_a4 = auVar34._4_4_;
      fStack_a0 = auVar34._8_4_;
      fStack_9c = auVar34._12_4_;
      auVar22._4_4_ = (int)fStack_94;
      auVar22._0_4_ = (int)local_98;
      auVar22._8_4_ = (int)fStack_90;
      auVar22._12_4_ = (int)fStack_8c;
      auVar34._4_4_ = (int)fStack_a4;
      auVar34._0_4_ = (int)local_a8;
      auVar34._8_4_ = (int)fStack_a0;
      auVar34._12_4_ = (int)fStack_9c;
      auVar34 = packssdw(auVar22,auVar34);
      local_d88._2_2_ = auVar34._2_2_;
      *(undefined2 *)(lVar31 + (long)((0xf - local_b2c) * in_EDX) * 2) = local_d88._2_2_;
      *(short *)(lVar31 + (long)((local_b2c + 0x11) * in_EDX) * 2) = auVar34._10_2_;
      *(short *)(in_RSI + (long)((0xf - local_b2c) * in_EDX) * 2) = auVar34._0_2_;
      *(short *)(in_RSI + (long)((local_b2c + 0x11) * in_EDX) * 2) = auVar34._8_2_;
      local_d88._6_2_ = auVar34._6_2_;
      *(undefined2 *)(lVar31 + (long)((0x2f - local_b2c) * in_EDX) * 2) = local_d88._6_2_;
      *(short *)(lVar31 + (long)((local_b2c + 0x31) * in_EDX) * 2) = auVar34._14_2_;
      local_d88._4_2_ = auVar34._4_2_;
      *(undefined2 *)(in_RSI + (long)((0x2f - local_b2c) * in_EDX) * 2) = local_d88._4_2_;
      *(short *)(in_RSI + (long)((local_b2c + 0x31) * in_EDX) * 2) = auVar34._12_2_;
    }
  }
  return;
}

Assistant:

static void mp3d_synth(float *xl, mp3d_sample_t *dstl, int nch, float *lins)
{
    int i;
    float *xr = xl + 576*(nch - 1);
    mp3d_sample_t *dstr = dstl + (nch - 1);

    static const float g_win[] = {
        -1,26,-31,208,218,401,-519,2063,2000,4788,-5517,7134,5959,35640,-39336,74992,
        -1,24,-35,202,222,347,-581,2080,1952,4425,-5879,7640,5288,33791,-41176,74856,
        -1,21,-38,196,225,294,-645,2087,1893,4063,-6237,8092,4561,31947,-43006,74630,
        -1,19,-41,190,227,244,-711,2085,1822,3705,-6589,8492,3776,30112,-44821,74313,
        -1,17,-45,183,228,197,-779,2075,1739,3351,-6935,8840,2935,28289,-46617,73908,
        -1,16,-49,176,228,153,-848,2057,1644,3004,-7271,9139,2037,26482,-48390,73415,
        -2,14,-53,169,227,111,-919,2032,1535,2663,-7597,9389,1082,24694,-50137,72835,
        -2,13,-58,161,224,72,-991,2001,1414,2330,-7910,9592,70,22929,-51853,72169,
        -2,11,-63,154,221,36,-1064,1962,1280,2006,-8209,9750,-998,21189,-53534,71420,
        -2,10,-68,147,215,2,-1137,1919,1131,1692,-8491,9863,-2122,19478,-55178,70590,
        -3,9,-73,139,208,-29,-1210,1870,970,1388,-8755,9935,-3300,17799,-56778,69679,
        -3,8,-79,132,200,-57,-1283,1817,794,1095,-8998,9966,-4533,16155,-58333,68692,
        -4,7,-85,125,189,-83,-1356,1759,605,814,-9219,9959,-5818,14548,-59838,67629,
        -4,7,-91,117,177,-106,-1428,1698,402,545,-9416,9916,-7154,12980,-61289,66494,
        -5,6,-97,111,163,-127,-1498,1634,185,288,-9585,9838,-8540,11455,-62684,65290
    };
    float *zlin = lins + 15*64;
    const float *w = g_win;

    zlin[4*15]     = xl[18*16];
    zlin[4*15 + 1] = xr[18*16];
    zlin[4*15 + 2] = xl[0];
    zlin[4*15 + 3] = xr[0];

    zlin[4*31]     = xl[1 + 18*16];
    zlin[4*31 + 1] = xr[1 + 18*16];
    zlin[4*31 + 2] = xl[1];
    zlin[4*31 + 3] = xr[1];

    mp3d_synth_pair(dstr, nch, lins + 4*15 + 1);
    mp3d_synth_pair(dstr + 32*nch, nch, lins + 4*15 + 64 + 1);
    mp3d_synth_pair(dstl, nch, lins + 4*15);
    mp3d_synth_pair(dstl + 32*nch, nch, lins + 4*15 + 64);

#if HAVE_SIMD
    if (have_simd()) for (i = 14; i >= 0; i--)
    {
#define VLOAD(k) f4 w0 = VSET(*w++); f4 w1 = VSET(*w++); f4 vz = VLD(&zlin[4*i - 64*k]); f4 vy = VLD(&zlin[4*i - 64*(15 - k)]);
#define V0(k) { VLOAD(k) b =         VADD(VMUL(vz, w1), VMUL(vy, w0)) ; a =         VSUB(VMUL(vz, w0), VMUL(vy, w1));  }
#define V1(k) { VLOAD(k) b = VADD(b, VADD(VMUL(vz, w1), VMUL(vy, w0))); a = VADD(a, VSUB(VMUL(vz, w0), VMUL(vy, w1))); }
#define V2(k) { VLOAD(k) b = VADD(b, VADD(VMUL(vz, w1), VMUL(vy, w0))); a = VADD(a, VSUB(VMUL(vy, w1), VMUL(vz, w0))); }
        f4 a, b;
        zlin[4*i]     = xl[18*(31 - i)];
        zlin[4*i + 1] = xr[18*(31 - i)];
        zlin[4*i + 2] = xl[1 + 18*(31 - i)];
        zlin[4*i + 3] = xr[1 + 18*(31 - i)];
        zlin[4*i + 64] = xl[1 + 18*(1 + i)];
        zlin[4*i + 64 + 1] = xr[1 + 18*(1 + i)];
        zlin[4*i - 64 + 2] = xl[18*(1 + i)];
        zlin[4*i - 64 + 3] = xr[18*(1 + i)];

        V0(0) V2(1) V1(2) V2(3) V1(4) V2(5) V1(6) V2(7)

        {
#ifndef MINIMP3_FLOAT_OUTPUT
#if HAVE_SSE
            static const f4 g_max = { 32767.0f, 32767.0f, 32767.0f, 32767.0f };
            static const f4 g_min = { -32768.0f, -32768.0f, -32768.0f, -32768.0f };
            __m128i pcm8 = _mm_packs_epi32(_mm_cvtps_epi32(_mm_max_ps(_mm_min_ps(a, g_max), g_min)),
                                           _mm_cvtps_epi32(_mm_max_ps(_mm_min_ps(b, g_max), g_min)));
            dstr[(15 - i)*nch] = _mm_extract_epi16(pcm8, 1);
            dstr[(17 + i)*nch] = _mm_extract_epi16(pcm8, 5);
            dstl[(15 - i)*nch] = _mm_extract_epi16(pcm8, 0);
            dstl[(17 + i)*nch] = _mm_extract_epi16(pcm8, 4);
            dstr[(47 - i)*nch] = _mm_extract_epi16(pcm8, 3);
            dstr[(49 + i)*nch] = _mm_extract_epi16(pcm8, 7);
            dstl[(47 - i)*nch] = _mm_extract_epi16(pcm8, 2);
            dstl[(49 + i)*nch] = _mm_extract_epi16(pcm8, 6);
#else /* HAVE_SSE */
            int16x4_t pcma, pcmb;
            a = VADD(a, VSET(0.5f));
            b = VADD(b, VSET(0.5f));
            pcma = vqmovn_s32(vqaddq_s32(vcvtq_s32_f32(a), vreinterpretq_s32_u32(vcltq_f32(a, VSET(0)))));
            pcmb = vqmovn_s32(vqaddq_s32(vcvtq_s32_f32(b), vreinterpretq_s32_u32(vcltq_f32(b, VSET(0)))));
            vst1_lane_s16(dstr + (15 - i)*nch, pcma, 1);
            vst1_lane_s16(dstr + (17 + i)*nch, pcmb, 1);
            vst1_lane_s16(dstl + (15 - i)*nch, pcma, 0);
            vst1_lane_s16(dstl + (17 + i)*nch, pcmb, 0);
            vst1_lane_s16(dstr + (47 - i)*nch, pcma, 3);
            vst1_lane_s16(dstr + (49 + i)*nch, pcmb, 3);
            vst1_lane_s16(dstl + (47 - i)*nch, pcma, 2);
            vst1_lane_s16(dstl + (49 + i)*nch, pcmb, 2);
#endif /* HAVE_SSE */

#else /* MINIMP3_FLOAT_OUTPUT */

            static const f4 g_scale = { 1.0f/32768.0f, 1.0f/32768.0f, 1.0f/32768.0f, 1.0f/32768.0f };
            a = VMUL(a, g_scale);
            b = VMUL(b, g_scale);
#if HAVE_SSE
            _mm_store_ss(dstr + (15 - i)*nch, _mm_shuffle_ps(a, a, _MM_SHUFFLE(1, 1, 1, 1)));
            _mm_store_ss(dstr + (17 + i)*nch, _mm_shuffle_ps(b, b, _MM_SHUFFLE(1, 1, 1, 1)));
            _mm_store_ss(dstl + (15 - i)*nch, _mm_shuffle_ps(a, a, _MM_SHUFFLE(0, 0, 0, 0)));
            _mm_store_ss(dstl + (17 + i)*nch, _mm_shuffle_ps(b, b, _MM_SHUFFLE(0, 0, 0, 0)));
            _mm_store_ss(dstr + (47 - i)*nch, _mm_shuffle_ps(a, a, _MM_SHUFFLE(3, 3, 3, 3)));
            _mm_store_ss(dstr + (49 + i)*nch, _mm_shuffle_ps(b, b, _MM_SHUFFLE(3, 3, 3, 3)));
            _mm_store_ss(dstl + (47 - i)*nch, _mm_shuffle_ps(a, a, _MM_SHUFFLE(2, 2, 2, 2)));
            _mm_store_ss(dstl + (49 + i)*nch, _mm_shuffle_ps(b, b, _MM_SHUFFLE(2, 2, 2, 2)));
#else /* HAVE_SSE */
            vst1q_lane_f32(dstr + (15 - i)*nch, a, 1);
            vst1q_lane_f32(dstr + (17 + i)*nch, b, 1);
            vst1q_lane_f32(dstl + (15 - i)*nch, a, 0);
            vst1q_lane_f32(dstl + (17 + i)*nch, b, 0);
            vst1q_lane_f32(dstr + (47 - i)*nch, a, 3);
            vst1q_lane_f32(dstr + (49 + i)*nch, b, 3);
            vst1q_lane_f32(dstl + (47 - i)*nch, a, 2);
            vst1q_lane_f32(dstl + (49 + i)*nch, b, 2);
#endif /* HAVE_SSE */
#endif /* MINIMP3_FLOAT_OUTPUT */
        }
    } else
#endif /* HAVE_SIMD */
#ifdef MINIMP3_ONLY_SIMD
    {}
#else /* MINIMP3_ONLY_SIMD */
    for (i = 14; i >= 0; i--)
    {
#define LOAD(k) float w0 = *w++; float w1 = *w++; float *vz = &zlin[4*i - k*64]; float *vy = &zlin[4*i - (15 - k)*64];
#define S0(k) { int j; LOAD(k); for (j = 0; j < 4; j++) b[j]  = vz[j]*w1 + vy[j]*w0, a[j]  = vz[j]*w0 - vy[j]*w1; }
#define S1(k) { int j; LOAD(k); for (j = 0; j < 4; j++) b[j] += vz[j]*w1 + vy[j]*w0, a[j] += vz[j]*w0 - vy[j]*w1; }
#define S2(k) { int j; LOAD(k); for (j = 0; j < 4; j++) b[j] += vz[j]*w1 + vy[j]*w0, a[j] += vy[j]*w1 - vz[j]*w0; }
        float a[4], b[4];

        zlin[4*i]     = xl[18*(31 - i)];
        zlin[4*i + 1] = xr[18*(31 - i)];
        zlin[4*i + 2] = xl[1 + 18*(31 - i)];
        zlin[4*i + 3] = xr[1 + 18*(31 - i)];
        zlin[4*(i + 16)]   = xl[1 + 18*(1 + i)];
        zlin[4*(i + 16) + 1] = xr[1 + 18*(1 + i)];
        zlin[4*(i - 16) + 2] = xl[18*(1 + i)];
        zlin[4*(i - 16) + 3] = xr[18*(1 + i)];

        S0(0) S2(1) S1(2) S2(3) S1(4) S2(5) S1(6) S2(7)

        dstr[(15 - i)*nch] = mp3d_scale_pcm(a[1]);
        dstr[(17 + i)*nch] = mp3d_scale_pcm(b[1]);
        dstl[(15 - i)*nch] = mp3d_scale_pcm(a[0]);
        dstl[(17 + i)*nch] = mp3d_scale_pcm(b[0]);
        dstr[(47 - i)*nch] = mp3d_scale_pcm(a[3]);
        dstr[(49 + i)*nch] = mp3d_scale_pcm(b[3]);
        dstl[(47 - i)*nch] = mp3d_scale_pcm(a[2]);
        dstl[(49 + i)*nch] = mp3d_scale_pcm(b[2]);
    }
#endif /* MINIMP3_ONLY_SIMD */
}